

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O3

bool __thiscall
QHttpNetworkRequestPrivate::operator==
          (QHttpNetworkRequestPrivate *this,QHttpNetworkRequestPrivate *other)

{
  Operation OVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  
  bVar3 = QHttpNetworkHeaderPrivate::operator==
                    (&this->super_QHttpNetworkHeaderPrivate,&other->super_QHttpNetworkHeaderPrivate)
  ;
  if (((((((bVar3) && (OVar1 = this->operation, OVar1 == other->operation)) &&
         (lVar2 = (this->fullLocalServerName).d.size, lVar2 == (other->fullLocalServerName).d.size))
        && (((QVar5.m_data = (this->fullLocalServerName).d.ptr, QVar5.m_size = lVar2,
             QVar7.m_data = (other->fullLocalServerName).d.ptr, QVar7.m_size = lVar2,
             cVar4 = QtPrivate::equalStrings(QVar5,QVar7), cVar4 != '\0' &&
             (this->priority == other->priority)) &&
            ((this->uploadByteDevice == other->uploadByteDevice &&
             ((this->autoDecompress == other->autoDecompress &&
              (this->pipeliningAllowed == other->pipeliningAllowed)))))))) &&
       ((this->http2Allowed == other->http2Allowed &&
        ((this->http2Direct == other->http2Direct && (this->h2cAllowed == other->h2cAllowed)))))) &&
      (((OVar1 != Custom || (bVar3 = ::operator==(&this->customVerb,&other->customVerb), bVar3)) &&
       ((((this->withCredentials == other->withCredentials && (this->ssl == other->ssl)) &&
         (this->preConnect == other->preConnect)) &&
        ((this->redirectPolicy == other->redirectPolicy &&
         (lVar2 = (this->peerVerifyName).d.size, lVar2 == (other->peerVerifyName).d.size)))))))) &&
     (QVar6.m_data = (this->peerVerifyName).d.ptr, QVar6.m_size = lVar2,
     QVar8.m_data = (other->peerVerifyName).d.ptr, QVar8.m_size = lVar2,
     cVar4 = QtPrivate::equalStrings(QVar6,QVar8), cVar4 != '\0')) {
    return this->needResendWithCredentials == other->needResendWithCredentials;
  }
  return false;
}

Assistant:

bool QHttpNetworkRequestPrivate::operator==(const QHttpNetworkRequestPrivate &other) const
{
    return QHttpNetworkHeaderPrivate::operator==(other)
        && (operation == other.operation)
        && (fullLocalServerName == other.fullLocalServerName)
        && (priority == other.priority)
        && (uploadByteDevice == other.uploadByteDevice)
        && (autoDecompress == other.autoDecompress)
        && (pipeliningAllowed == other.pipeliningAllowed)
        && (http2Allowed == other.http2Allowed)
        && (http2Direct == other.http2Direct)
        && (h2cAllowed == other.h2cAllowed)
        // we do not clear the customVerb in setOperation
        && (operation != QHttpNetworkRequest::Custom || (customVerb == other.customVerb))
        && (withCredentials == other.withCredentials)
        && (ssl == other.ssl)
        && (preConnect == other.preConnect)
        && (redirectPolicy == other.redirectPolicy)
        && (peerVerifyName == other.peerVerifyName)
        && (needResendWithCredentials == other.needResendWithCredentials)
        ;
}